

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

Matrix * __thiscall Matrix::transpose(Matrix *this)

{
  uint uVar1;
  double *pdVar2;
  int *piVar3;
  uint uVar4;
  int j_1;
  void *pvVar5;
  double *p;
  int *piVar6;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int j;
  uint uVar13;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  shared_array<double> local_40;
  
  uVar1 = this->nMatrixDimension;
  lVar11 = (long)(int)uVar1;
  uVar12 = lVar11 * 4;
  if (lVar11 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar12);
  uVar13 = this->nData;
  uVar7 = (long)(int)uVar13 * 8;
  if ((long)(int)uVar13 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  p = (double *)operator_new__(uVar7);
  piVar6 = (int *)operator_new__(uVar12);
  piVar15 = this->pSize;
  uVar7 = 0;
  uVar16 = 0;
  uVar4 = uVar1;
  if (0 < (int)uVar1) {
    uVar16 = (ulong)uVar1;
  }
  for (; uVar16 != uVar7; uVar7 = uVar7 + 1) {
    piVar6[uVar7] = piVar15[(int)(uVar4 - 1)];
    uVar4 = uVar4 - 1;
  }
  piVar8 = (int *)operator_new__(uVar12);
  iVar10 = 1;
  while (lVar11 = lVar11 + -1, lVar11 != -1) {
    piVar8[lVar11] = iVar10;
    iVar10 = iVar10 * piVar6[lVar11];
  }
  pdVar2 = this->pData;
  piVar3 = this->pMult;
  uVar7 = 0;
  uVar12 = 0;
  if (0 < (int)uVar13) {
    uVar12 = (ulong)uVar13;
  }
  for (; uVar7 != uVar12; uVar7 = uVar7 + 1) {
    uVar9 = uVar7;
    for (uVar14 = 0; iVar10 = (int)uVar9, uVar16 != uVar14; uVar14 = uVar14 + 1) {
      uVar9 = (long)iVar10 % (long)piVar3[uVar14];
      *(int *)((long)pvVar5 + uVar14 * 4) = iVar10 / piVar3[uVar14];
    }
    iVar10 = 0;
    uVar13 = uVar1;
    for (uVar9 = 0; uVar13 = uVar13 - 1, uVar16 != uVar9; uVar9 = uVar9 + 1) {
      iVar10 = iVar10 + piVar8[uVar9] * *(int *)((long)pvVar5 + (long)(int)uVar13 * 4);
    }
    p[iVar10] = pdVar2[uVar7];
  }
  if (piVar3 != (int *)0x0) {
    operator_delete__(piVar3);
    piVar15 = this->pSize;
  }
  this->pMult = piVar8;
  if (piVar15 != (int *)0x0) {
    operator_delete__(piVar15);
  }
  this->pSize = piVar6;
  this->pData = p;
  boost::shared_array<double>::shared_array<double,MatrixDataDeleter>
            (&local_40,p,(MatrixDataDeleter)SUB41(*(undefined4 *)&this->bReference,0));
  boost::shared_array<double>::operator=(&this->matrixParent,&local_40);
  boost::detail::shared_count::~shared_count(&local_40.pn);
  return this;
}

Assistant:

Matrix &Matrix::transpose()
{
	int *indexes = new int[nMatrixDimension]; // array with indexes
	double *newData = new double[nData]; // array for re-arranged values
	
	// array with new shape
	int *newSize = new int[nMatrixDimension]; 
	for( int i=0; i<nMatrixDimension; i++ )
		newSize[i] = pSize[nMatrixDimension- i-1];
	
	// array with new multipliers
	int *newMult = new int[nMatrixDimension];
	int m = 1;
	for(int i=nMatrixDimension-1; i+1; i--) {
		newMult[i] = m;
		m *= newSize[i];
	}
	
	for( int i=0; i<nData; i++ ) {
		// find index of data i
		int remainder = i;
		for( int j=0; j<nMatrixDimension; j++) {
			indexes[j] = remainder / pMult[j];
			remainder -= indexes[j] * pMult[j]; // modulo :-)
		}
		// find new offset by re-interpreting index
		int newOffset = 0;
		for( int j=0; j<nMatrixDimension; j++)
			newOffset += indexes[nMatrixDimension-j-1] * newMult[j];
		// write into new position
		newData[ newOffset ] = pData[i];
	}	
	
	// save new data
	delete[] pMult;
	pMult = newMult;
	delete[] pSize;
	pSize = newSize;
	pData = newData;
	matrixParent = shared_array<double>(newData, MatrixDataDeleter(this));
	
	// bye.
	return *this;
}